

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O2

void __thiscall
OctreeTracer::CmdBeamRenderPass
          (OctreeTracer *this,shared_ptr<myvk::CommandBuffer> *command_buffer,uint32_t current_frame
          )

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pFVar3;
  CommandBuffer *pCVar4;
  long lVar5;
  float fVar6;
  initializer_list<VkClearValue> __l;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l_00;
  initializer_list<VkRect2D> __l_01;
  initializer_list<VkViewport> __l_02;
  allocator_type local_b9;
  undefined1 local_b8 [32];
  float origin_size;
  undefined4 uStack_94;
  int iStack_90;
  int iStack_8c;
  pointer local_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  __shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (this->m_beam_enable == true) {
    pFVar3 = (this->m_frame_resources).
             super__Vector_base<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    origin_size = 0.0;
    uStack_94 = 0;
    _iStack_90 = 0x3f80000000000000;
    __l._M_len = 1;
    __l._M_array = (iterator)&origin_size;
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::vector
              ((vector<VkClearValue,_std::allocator<VkClearValue>_> *)local_b8,__l,
               (allocator_type *)&local_78);
    myvk::CommandBuffer::CmdBeginRenderPass
              (pCVar4,&this->m_beam_render_pass,&pFVar3[current_frame].m_beam_framebuffer,
               (vector<VkClearValue,_std::allocator<VkClearValue>_> *)local_b8,
               VK_SUBPASS_CONTENTS_INLINE);
    std::_Vector_base<VkClearValue,_std::allocator<VkClearValue>_>::~_Vector_base
              ((_Vector_base<VkClearValue,_std::allocator<VkClearValue>_> *)local_b8);
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<myvk::GraphicsPipeline,void>
              ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)local_b8,
               &(this->m_beam_graphics_pipeline).
                super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>);
    myvk::CommandBuffer::CmdBindPipeline(pCVar4,(Ptr<PipelineBase> *)local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)local_b8,
               &(((this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->m_descriptor_set).
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 0x10),
               &(((this->m_camera_ptr).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->m_descriptor_sets).
                super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                ._M_impl.super__Vector_impl_data._M_start[current_frame].
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_b8;
    std::
    vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
    ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              *)&origin_size,__l_00,&local_b9);
    std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<myvk::GraphicsPipeline,void>
              (local_58,&(this->m_beam_graphics_pipeline).
                         super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>);
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    myvk::CommandBuffer::CmdBindDescriptorSets
              (pCVar4,(vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                       *)&origin_size,(Ptr<PipelineBase> *)local_58,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    std::
    vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
    ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
               *)&origin_size);
    lVar5 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + lVar5));
      lVar5 = lVar5 + -0x10;
    } while (lVar5 != -8);
    uVar1 = this->m_width;
    uVar2 = this->m_height;
    local_48 = (uVar1 + 7 >> 3) + 1;
    iStack_44 = (uVar2 + 7 >> 3) + 1;
    uStack_40 = 1;
    uStack_3c = 1;
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    origin_size = 0.0;
    uStack_94 = 0;
    iStack_8c = iStack_44;
    iStack_90 = local_48;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&origin_size;
    std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
              ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)local_b8,__l_01,
               (allocator_type *)&local_78);
    myvk::CommandBuffer::CmdSetScissor
              (pCVar4,(vector<VkRect2D,_std::allocator<VkRect2D>_> *)local_b8);
    std::_Vector_base<VkRect2D,_std::allocator<VkRect2D>_>::~_Vector_base
              ((_Vector_base<VkRect2D,_std::allocator<VkRect2D>_> *)local_b8);
    _iStack_90 = CONCAT44((float)iStack_44,(float)local_48);
    pCVar4 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    origin_size = 0.0;
    uStack_94 = 0;
    local_88 = (pointer)0x0;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&origin_size;
    std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
              ((vector<VkViewport,_std::allocator<VkViewport>_> *)local_b8,__l_02,
               (allocator_type *)&local_78);
    myvk::CommandBuffer::CmdSetViewport
              (pCVar4,(vector<VkViewport,_std::allocator<VkViewport>_> *)local_b8);
    std::_Vector_base<VkViewport,_std::allocator<VkViewport>_>::~_Vector_base
              ((_Vector_base<VkViewport,_std::allocator<VkViewport>_> *)local_b8);
    local_b8._0_8_ = *(undefined8 *)&this->m_width;
    local_b8._8_4_ = 8;
    myvk::CommandBuffer::CmdPushConstants
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr,&this->m_beam_pipeline_layout,0x10,0,0xc,local_b8);
    fVar6 = exp2f(1.0 - (float)((this->m_octree_ptr).
                                super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                               m_level);
    origin_size = fVar6;
    myvk::CommandBuffer::CmdPushConstants
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr,&this->m_beam_pipeline_layout,0x10,0xc,4,&origin_size);
    myvk::CommandBuffer::CmdDraw
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr,3,1,0,0);
    myvk::CommandBuffer::CmdEndRenderPass
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr);
  }
  return;
}

Assistant:

void OctreeTracer::CmdBeamRenderPass(const std::shared_ptr<myvk::CommandBuffer> &command_buffer,
                                     uint32_t current_frame) const {
	if (!m_beam_enable)
		return;
	const auto &cur = m_frame_resources[current_frame];
	command_buffer->CmdBeginRenderPass(m_beam_render_pass, cur.m_beam_framebuffer, {{{0.0f, 0.0f, 0.0f, 1.0f}}});
	command_buffer->CmdBindPipeline(m_beam_graphics_pipeline);
	command_buffer->CmdBindDescriptorSets(
	    {m_octree_ptr->GetDescriptorSet(), m_camera_ptr->GetFrameDescriptorSet(current_frame)},
	    m_beam_graphics_pipeline);

	uint32_t beam_width = get_beam_size(m_width), beam_height = get_beam_size(m_height);
	VkRect2D scissor = {};
	scissor.extent = {beam_width, beam_height};
	command_buffer->CmdSetScissor({scissor});
	VkViewport viewport = {};
	viewport.width = beam_width;
	viewport.height = beam_height;
	command_buffer->CmdSetViewport({viewport});

	uint32_t uint_push_constants[] = {m_width, m_height, kBeamSize};
	command_buffer->CmdPushConstants(m_beam_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, 0,
	                                 sizeof(uint_push_constants), uint_push_constants);
	float origin_size = exp2f(1.0f - m_octree_ptr->GetLevel());
	command_buffer->CmdPushConstants(m_beam_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, sizeof(uint_push_constants),
	                                 sizeof(float), &origin_size);
	command_buffer->CmdDraw(3, 1, 0, 0);
	command_buffer->CmdEndRenderPass();
}